

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  char cVar2;
  long *plVar3;
  char command;
  FTP *ftp;
  char *type;
  Curl_easy *data;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  plVar3 = (long *)(*Curl_ccalloc)(0x20,1);
  (conn->data->req).protop = plVar3;
  if (plVar3 == (long *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    *plVar3 = (long)((pCVar1->state).up.path + 1);
    ftp = (FTP *)strstr((char *)*plVar3,";type=");
    if (ftp == (FTP *)0x0) {
      ftp = (FTP *)strstr((conn->host).rawalloc,";type=");
    }
    if (ftp != (FTP *)0x0) {
      *(undefined1 *)&ftp->path = 0;
      cVar2 = Curl_raw_toupper(*(char *)((long)&ftp->path + 6));
      *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 | 0x4000000;
      if (cVar2 == 'A') {
        *(ulong *)&(pCVar1->set).field_0x8e8 =
             *(ulong *)&(pCVar1->set).field_0x8e8 & 0xfffffffffffff7ff | 0x800;
      }
      else if (cVar2 == 'D') {
        *(ulong *)&(pCVar1->set).field_0x8e8 =
             *(ulong *)&(pCVar1->set).field_0x8e8 & 0xffffffffffffdfff | 0x2000;
      }
      else {
        *(ulong *)&(pCVar1->set).field_0x8e8 =
             *(ulong *)&(pCVar1->set).field_0x8e8 & 0xfffffffffffff7ff;
      }
    }
    *(undefined4 *)(plVar3 + 2) = 0;
    plVar3[3] = 0;
    (conn->proto).ftpc.known_filesize = -1;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  char *type;
  struct FTP *ftp;

  conn->data->req.protop = ftp = calloc(sizeof(struct FTP), 1);
  if(NULL == ftp)
    return CURLE_OUT_OF_MEMORY;

  ftp->path = &data->state.up.path[1]; /* don't include the initial slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);
    conn->bits.type_set = TRUE;

    switch(command) {
    case 'A': /* ASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->set.ftp_list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->transfer = FTPTRANSFER_BODY;
  ftp->downloadsize = 0;
  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}